

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_keypress(keycode_t k,uint8_t mods)

{
  keycode_t local_10;
  errr eStack_c;
  uint8_t mods_local;
  keycode_t k_local;
  
  if (k == 0) {
    eStack_c = -1;
  }
  else {
    local_10 = k;
    if ((Term->complex_input & 1U) == 0) {
      switch(k) {
      case 8:
        local_10 = 0x9f;
        break;
      case 9:
        local_10 = 0x9d;
        break;
      case 10:
      case 0xd:
        local_10 = 0x9c;
        break;
      case 0x1b:
        local_10 = 0xe000;
      }
    }
    Term->key_queue[Term->key_head].type = EVT_KBRD;
    (&Term->key_queue->key)[Term->key_head].code = local_10;
    (&Term->key_queue->key)[Term->key_head].mods = mods;
    Term->key_head = Term->key_head + 1;
    if (Term->key_head == Term->key_size) {
      Term->key_head = 0;
    }
    if (Term->key_head == Term->key_tail) {
      eStack_c = 1;
    }
    else {
      eStack_c = 0;
    }
  }
  return eStack_c;
}

Assistant:

errr Term_keypress(keycode_t k, uint8_t mods)
{
	/* Hack -- Refuse to enqueue non-keys */
	if (!k) return (-1);

	if(!Term->complex_input) {
		switch (k)
		{
			case '\r':
			case '\n':
			  	k = KC_ENTER;
			  	break;
			case 8:
			  	k = KC_BACKSPACE;
			  	break;
			case 9:
			  	k = KC_TAB;
			  	break;
			case 27:
			  	k = ESCAPE;
			  	break;
		}
	}

	/* Store the char, advance the queue */
	Term->key_queue[Term->key_head].type = EVT_KBRD;
	Term->key_queue[Term->key_head].key.code = k;
	Term->key_queue[Term->key_head].key.mods = mods;
	Term->key_head++;

	/* Circular queue, handle wrap */
	if (Term->key_head == Term->key_size) Term->key_head = 0;

	/* Success (unless overflow) */
	if (Term->key_head != Term->key_tail) return (0);

	/* Problem */
	return (1);
}